

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O0

void Dec_GraphPrint(FILE *pFile,Dec_Graph_t *pGraph,char **pNamesIn,char *pNameOut)

{
  char **pGraph_00;
  Dec_Graph_t *pDVar1;
  int iVar2;
  int fCompl;
  size_t sVar3;
  Dec_Node_t *pNode;
  int local_40;
  int local_3c;
  int i;
  int Pos;
  int LitSizeCur;
  int LitSizeMax;
  Vec_Ptr_t *vNamesIn;
  char *pNameOut_local;
  char **pNamesIn_local;
  Dec_Graph_t *pGraph_local;
  FILE *pFile_local;
  
  _LitSizeCur = (Vec_Ptr_t *)0x0;
  vNamesIn = (Vec_Ptr_t *)pNameOut;
  pNameOut_local = (char *)pNamesIn;
  pNamesIn_local = (char **)pGraph;
  pGraph_local = (Dec_Graph_t *)pFile;
  if (pNamesIn == (char **)0x0) {
    iVar2 = Dec_GraphLeaveNum(pGraph);
    _LitSizeCur = Abc_NodeGetFakeNames(iVar2);
    pNameOut_local = (char *)_LitSizeCur->pArray;
  }
  if (vNamesIn == (Vec_Ptr_t *)0x0) {
    vNamesIn = (Vec_Ptr_t *)0xc81cda;
  }
  Pos = 0;
  for (local_40 = 0; iVar2 = Dec_GraphLeaveNum((Dec_Graph_t *)pNamesIn_local), local_40 < iVar2;
      local_40 = local_40 + 1) {
    sVar3 = strlen(*(char **)(pNameOut_local + (long)local_40 * 8));
    i = (int)sVar3;
    if (Pos < i) {
      Pos = i;
    }
  }
  if (0x32 < Pos) {
    Pos = 0x14;
  }
  iVar2 = Dec_GraphIsConst((Dec_Graph_t *)pNamesIn_local);
  if (iVar2 == 0) {
    iVar2 = Dec_GraphIsVar((Dec_Graph_t *)pNamesIn_local);
    if (iVar2 == 0) {
      local_3c = Dec_GraphPrintOutputName((FILE *)pGraph_local,(char *)vNamesIn);
      pDVar1 = pGraph_local;
      pGraph_00 = pNamesIn_local;
      pNode = Dec_GraphNodeLast((Dec_Graph_t *)pNamesIn_local);
      iVar2 = Dec_GraphIsComplement((Dec_Graph_t *)pNamesIn_local);
      Dec_GraphPrint_rec((FILE *)pDVar1,(Dec_Graph_t *)pGraph_00,pNode,iVar2,(char **)pNameOut_local
                         ,&local_3c,Pos);
    }
    else {
      local_3c = Dec_GraphPrintOutputName((FILE *)pGraph_local,(char *)vNamesIn);
      pDVar1 = pGraph_local;
      iVar2 = Dec_GraphVarInt((Dec_Graph_t *)pNamesIn_local);
      fCompl = Dec_GraphIsComplement((Dec_Graph_t *)pNamesIn_local);
      Dec_GraphPrintGetLeafName((FILE *)pDVar1,iVar2,fCompl,(char **)pNameOut_local);
    }
  }
  else {
    local_3c = Dec_GraphPrintOutputName((FILE *)pGraph_local,(char *)vNamesIn);
    pDVar1 = pGraph_local;
    iVar2 = Dec_GraphIsComplement((Dec_Graph_t *)pNamesIn_local);
    fprintf((FILE *)pDVar1,"Constant %d",(ulong)((iVar2 != 0 ^ 0xffU) & 1));
  }
  fprintf((FILE *)pGraph_local,"\n");
  if (_LitSizeCur != (Vec_Ptr_t *)0x0) {
    Abc_NodeFreeNames(_LitSizeCur);
  }
  return;
}

Assistant:

void Dec_GraphPrint( FILE * pFile, Dec_Graph_t * pGraph, char * pNamesIn[], char * pNameOut )
{
    Vec_Ptr_t * vNamesIn = NULL;
    int LitSizeMax, LitSizeCur, Pos, i;

    // create the names if not given by the user
    if ( pNamesIn == NULL )
    {
        vNamesIn = Abc_NodeGetFakeNames( Dec_GraphLeaveNum(pGraph) );
        pNamesIn = (char **)vNamesIn->pArray;
    }
    if ( pNameOut == NULL )
        pNameOut = "F";

    // get the size of the longest literal
    LitSizeMax = 0;
    for ( i = 0; i < Dec_GraphLeaveNum(pGraph); i++ )
    {
        LitSizeCur = strlen(pNamesIn[i]);
        if ( LitSizeMax < LitSizeCur )
            LitSizeMax = LitSizeCur;
    }
    if ( LitSizeMax > 50 )
        LitSizeMax = 20;

    // write the decomposition graph (factored form)
    if ( Dec_GraphIsConst(pGraph) ) // constant
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        fprintf( pFile, "Constant %d", !Dec_GraphIsComplement(pGraph) );
    }
    else if ( Dec_GraphIsVar(pGraph) ) // literal
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrintGetLeafName( pFile, Dec_GraphVarInt(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn );
    }
    else
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrint_rec( pFile, pGraph, Dec_GraphNodeLast(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn, &Pos, LitSizeMax );
    }
    fprintf( pFile, "\n" );

    if ( vNamesIn )
        Abc_NodeFreeNames( vNamesIn );
}